

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::String::FormatIntWidthN_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value,int width)

{
  long lVar1;
  char cVar2;
  stringstream ss;
  undefined1 auStack_1b8 [8];
  stringstream local_1b0 [16];
  long local_1a0 [2];
  long alStack_190 [12];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_1b8 + (char)lVar1 + '\x18');
    acStack_c0[lVar1] = cVar2;
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = '0';
  *(long *)((long)alStack_190 + *(long *)(local_1a0[0] + -0x18)) = (long)value;
  std::ostream::operator<<((ostream *)local_1a0,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidthN(int value, int width) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(width) << value;
  return ss.str();
}